

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  s_linkedlist_unittest *psVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  s_linkedlist_unittest *psVar6;
  
  if (gl_unit_tests[0].name == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    psVar6 = gl_unit_tests;
    iVar3 = 0;
    uVar5 = 1;
    do {
      iVar2 = (*psVar6->fun_unit_test)();
      pcVar4 = "PASS";
      if (iVar2 != 1) {
        pcVar4 = "FAIL";
      }
      printf("[%s] %s\n",pcVar4,psVar6->name);
      iVar3 = iVar3 + (uint)(iVar2 != 1);
      psVar6 = gl_unit_tests + uVar5;
      psVar1 = gl_unit_tests + uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (psVar1->name != (char *)0x0);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
    (void) argc;  // Unused parameter
    (void) argv;  // Unused parameter

    unsigned int idx           = 0;
    int          success_count = 0;
    int          error_count   = 0;

    while (gl_unit_tests[idx].name != NULL) {
        int ret = gl_unit_tests[idx].fun_unit_test();
        printf("[%s] %s\n", ret == 1 ? "PASS" : "FAIL", gl_unit_tests[idx].name);

        if (ret == 1) {
            success_count += 1;
        } else {
            error_count += 1;
        }

        idx += 1;
    }

    return (error_count);
}